

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

float __thiscall
deqp::gles3::Functional::FloatScalar::getValue
          (FloatScalar *this,Functions *gl,ShaderType shaderType)

{
  Precision PVar1;
  float fVar2;
  
  if (this->m_isConstant == true) {
    return (this->m_value).constant;
  }
  switch((this->m_value).symbol) {
  case SYMBOL_LOWP_UINT_MAX:
    PVar1 = PRECISION_LOWP;
    break;
  case SYMBOL_MEDIUMP_UINT_MAX:
    PVar1 = PRECISION_MEDIUMP;
    break;
  case SYMBOL_LOWP_UINT_MAX_RECIPROCAL:
    PVar1 = PRECISION_LOWP;
    goto LAB_00fcf53e;
  case SYMBOL_MEDIUMP_UINT_MAX_RECIPROCAL:
    PVar1 = PRECISION_MEDIUMP;
LAB_00fcf53e:
    fVar2 = getGLSLUintMaxAsFloat(gl,shaderType,PVar1);
    return 1.0 / fVar2;
  case SYMBOL_ONE_MINUS_UINT32MAX_DIV_LOWP_UINT_MAX:
    PVar1 = PRECISION_LOWP;
    goto LAB_00fcf56e;
  case SYMBOL_ONE_MINUS_UINT32MAX_DIV_MEDIUMP_UINT_MAX:
    PVar1 = PRECISION_MEDIUMP;
LAB_00fcf56e:
    fVar2 = getGLSLUintMaxAsFloat(gl,shaderType,PVar1);
    return -4.2949673e+09 / fVar2 + 1.0;
  default:
    return 0.0;
  }
  fVar2 = getGLSLUintMaxAsFloat(gl,shaderType,PVar1);
  return fVar2;
}

Assistant:

float getValue (const glw::Functions& gl, ShaderType shaderType) const
	{
		if (m_isConstant)
			return m_value.constant;
		else
		{
			switch (m_value.symbol)
			{
				case SYMBOL_LOWP_UINT_MAX:								return getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_MEDIUMP_UINT_MAX:							return getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				case SYMBOL_LOWP_UINT_MAX_RECIPROCAL:					return 1.0f / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_MEDIUMP_UINT_MAX_RECIPROCAL:				return 1.0f / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				case SYMBOL_ONE_MINUS_UINT32MAX_DIV_LOWP_UINT_MAX:		return 1.0f - (float)std::numeric_limits<deUint32>::max() / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_ONE_MINUS_UINT32MAX_DIV_MEDIUMP_UINT_MAX:	return 1.0f - (float)std::numeric_limits<deUint32>::max() / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				default:
					DE_ASSERT(false);
					return 0.0f;
			}
		}
	}